

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

int loader_impl_handle_init
              (loader_impl impl,char *path,loader_handle_impl handle_impl,void **handle_ptr,
              int populated)

{
  int iVar1;
  
  iVar1 = loader_impl_function_hook_call(impl->ctx,"__metacall_initialize__");
  handle_impl->populated = populated;
  if (iVar1 != 0) {
    log_write_impl_va("metacall",0x2f6,"loader_impl_handle_init",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                      ,3,
                      "Error when calling to init hook function (__metacall_initialize__) of handle: %s"
                      ,path);
  }
  if (handle_ptr != (void **)0x0) {
    *handle_ptr = handle_impl;
  }
  return iVar1;
}

Assistant:

int loader_impl_handle_init(loader_impl impl, const char *path, loader_handle_impl handle_impl, void **handle_ptr, int populated)
{
	static const char func_init_name[] = LOADER_IMPL_FUNCTION_INIT;

	int result = loader_impl_function_hook_call(impl->ctx, func_init_name);

	handle_impl->populated = populated;

	if (result != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Error when calling to init hook function (" LOADER_IMPL_FUNCTION_INIT ") of handle: %s", path);
	}

	if (handle_ptr != NULL)
	{
		*handle_ptr = handle_impl;
	}

	return result;
}